

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor.cpp
# Opt level: O2

Trivia __thiscall
slang::parsing::Preprocessor::handleLineDirective(Preprocessor *this,Token directive)

{
  SourceManager *this_00;
  optional<unsigned_char> oVar1;
  LineDirectiveSyntax *syntax;
  SourceLocation location;
  optional<unsigned_long> oVar2;
  string_view name;
  SourceRange range;
  Token TStack_88;
  Token level;
  Token fileName;
  Token lineNumber;
  Token directive_local;
  Trivia local_38;
  
  directive_local.info = directive.info;
  directive_local._0_8_ = directive._0_8_;
  lineNumber = expect(this,IntegerLiteral);
  fileName = expect(this,StringLiteral);
  level = expect(this,IntegerLiteral);
  syntax = BumpAllocator::
           emplace<slang::syntax::LineDirectiveSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
                     (this->alloc,&directive_local,&lineNumber,&fileName,&level);
  if (((((undefined1  [16])lineNumber & (undefined1  [16])0x10000) == (undefined1  [16])0x0) &&
      (((undefined1  [16])fileName & (undefined1  [16])0x10000) == (undefined1  [16])0x0)) &&
     (((undefined1  [16])level & (undefined1  [16])0x10000) == (undefined1  [16])0x0)) {
    Token::intValue(&TStack_88);
    oVar1 = SVInt::as<unsigned_char>((SVInt *)&TStack_88);
    SVInt::~SVInt((SVInt *)&TStack_88);
    Token::intValue(&TStack_88);
    oVar2 = SVInt::as<unsigned_long>((SVInt *)&TStack_88);
    SVInt::~SVInt((SVInt *)&TStack_88);
    if ((oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_char>._M_engaged &
        oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_char>._M_payload < 3) == 0) {
      range = Token::range(&level);
      addDiag(this,(DiagCode)0xc0004,range);
    }
    else if (((undefined1  [16])
              oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long> & (undefined1  [16])0x1) !=
             (undefined1  [16])0x0) {
      this_00 = this->sourceManager;
      location = Token::location(&directive_local);
      name = Token::valueText(&fileName);
      SourceManager::addLineDirective
                (this_00,location,
                 oVar2.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload,name,
                 oVar1.super__Optional_base<unsigned_char,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_char>._M_payload);
    }
  }
  Trivia::Trivia(&local_38,Directive,(SyntaxNode *)syntax);
  return local_38;
}

Assistant:

Trivia Preprocessor::handleLineDirective(Token directive) {
    Token lineNumber = expect(TokenKind::IntegerLiteral);
    Token fileName = expect(TokenKind::StringLiteral);
    Token level = expect(TokenKind::IntegerLiteral);

    auto result = alloc.emplace<LineDirectiveSyntax>(directive, lineNumber, fileName, level);

    if (!lineNumber.isMissing() && !fileName.isMissing() && !level.isMissing()) {
        auto levNum = level.intValue().as<uint8_t>();
        auto lineNum = lineNumber.intValue().as<size_t>();

        if (!levNum.has_value() || (*levNum != 0 && *levNum != 1 && *levNum != 2)) {
            // We don't actually use the level for anything, but the spec allows
            // only the values 0,1,2
            addDiag(diag::InvalidLineDirectiveLevel, level.range());
        }
        else if (lineNum) {
            // We should only notify the source manager about the line directive if it
            // is well formed, to avoid very strange line number issues.
            sourceManager.addLineDirective(directive.location(), *lineNum, fileName.valueText(),
                                           *levNum);
        }
    }
    return Trivia(TriviaKind::Directive, result);
}